

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONHandler.cc
# Opt level: O3

void __thiscall JSONHandler::handle(JSONHandler *this,string *path,JSON *j)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  JSONHandler *this_00;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  undefined8 extraout_RAX;
  _Invoker_type *pp_Var6;
  _Head_base<0UL,_JSONHandler::Members_*,_false> _Var7;
  size_type *psVar8;
  _Any_data *p_Var9;
  bool bvalue;
  string path_base;
  string s_value;
  bool local_119;
  string local_118;
  JSON local_f8;
  JSON local_e8;
  JSON local_d8;
  JSON local_c8;
  string local_b8;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  _Var7._M_head_impl =
       (this->m)._M_t.
       super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>._M_t.
       super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
       super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
  if (*(long *)((long)&(_Var7._M_head_impl)->h + 0x10) != 0) {
    local_c8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (j->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_c8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (j->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_c8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_c8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_c8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
        if (*(long *)((long)&(_Var7._M_head_impl)->h + 0x10) == 0) {
          std::__throw_bad_function_call();
        }
      }
      else {
        (local_c8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_c8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    (**(_Invoker_type *)((long)&(_Var7._M_head_impl)->h + 0x18))
              ((_Any_data *)_Var7._M_head_impl,path,&local_c8);
    if (local_c8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    return;
  }
  local_119 = false;
  paVar1 = &local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  if (*(long *)((long)&(_Var7._M_head_impl)->h + 0x30) != 0) {
    bVar3 = JSON::isNull(j);
    _Var7._M_head_impl =
         (this->m)._M_t.
         super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>.
         _M_t.
         super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
         super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
    if (bVar3) {
      if (*(long *)((long)&(_Var7._M_head_impl)->h + 0x30) == 0) goto LAB_001288d2;
      (**(_Invoker_type *)((long)&(_Var7._M_head_impl)->h + 0x38))
                ((_Any_data *)((long)&(_Var7._M_head_impl)->h + 0x20),path);
      goto LAB_001288a6;
    }
  }
  if (*(long *)((long)_Var7._M_head_impl + 0x50) == 0) {
LAB_001284ee:
    if (*(long *)((long)_Var7._M_head_impl + 0x70) != 0) {
      bVar3 = JSON::getNumber(j,&local_b8);
      _Var7._M_head_impl =
           (this->m)._M_t.
           super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>.
           _M_t.
           super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>
           .super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
      if (bVar3) {
        if (*(long *)((long)&(_Var7._M_head_impl)->h + 0x70) == 0) goto LAB_001288d2;
        p_Var9 = (_Any_data *)((long)&(_Var7._M_head_impl)->h + 0x60);
        pp_Var6 = (_Invoker_type *)((long)&(_Var7._M_head_impl)->h + 0x78);
        goto LAB_0012851c;
      }
    }
    if (*(long *)((long)_Var7._M_head_impl + 0x90) != 0) {
      bVar3 = JSON::getBool(j,&local_119);
      _Var7._M_head_impl =
           (this->m)._M_t.
           super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>.
           _M_t.
           super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>
           .super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
      if (bVar3) {
        local_118._M_dataplus._M_p._0_1_ = local_119;
        if (*(long *)((long)&(_Var7._M_head_impl)->h + 0x90) == 0) {
LAB_001288d2:
          std::__throw_bad_function_call();
        }
        (**(_Invoker_type *)((long)&(_Var7._M_head_impl)->h + 0x98))
                  ((_Any_data *)((long)&(_Var7._M_head_impl)->h + 0x80),path,(bool *)&local_118);
        goto LAB_001288a6;
      }
    }
    if (*(long *)((long)_Var7._M_head_impl + 0xb0) != 0) {
      bVar3 = JSON::isDictionary(j);
      _Var7._M_head_impl =
           (this->m)._M_t.
           super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>.
           _M_t.
           super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>
           .super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
      if (bVar3) {
        local_d8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (j->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_d8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (j->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_d8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_d8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_d8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_d8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_d8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        if (*(long *)((long)&(_Var7._M_head_impl)->h + 0xb0) == 0) {
          std::__throw_bad_function_call();
        }
        (**(_Invoker_type *)((long)&(_Var7._M_head_impl)->h + 0xb8))
                  ((_Any_data *)((long)&(_Var7._M_head_impl)->h + 0xa0),path,&local_d8);
        if (local_d8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_d8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        pcVar2 = (path->_M_dataplus)._M_p;
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,pcVar2,pcVar2 + path->_M_string_length);
        iVar4 = std::__cxx11::string::compare((char *)&local_118);
        if (iVar4 != 0) {
          std::__cxx11::string::append((char *)&local_118);
        }
        local_68 = (code *)0x0;
        pcStack_60 = (code *)0x0;
        local_78._M_unused._M_object = (void *)0x0;
        local_78._8_8_ = 0;
        local_78._M_unused._M_object = operator_new(0x18);
        *(string **)local_78._M_unused._0_8_ = path;
        *(string **)((long)local_78._M_unused._0_8_ + 8) = &local_118;
        *(JSONHandler **)((long)local_78._M_unused._0_8_ + 0x10) = this;
        pcStack_60 = std::
                     _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/JSONHandler.cc:151:27)>
                     ::_M_invoke;
        local_68 = std::
                   _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/JSONHandler.cc:151:27)>
                   ::_M_manager;
        JSON::forEachDictItem
                  (j,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_JSON)>
                      *)&local_78);
        if (local_68 != (code *)0x0) {
          (*local_68)(&local_78,&local_78,__destroy_functor);
        }
        _Var7._M_head_impl =
             (this->m)._M_t.
             super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>
             ._M_t.
             super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>
             .super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
        if (*(_Manager_type *)((long)&(_Var7._M_head_impl)->h + 0xd0) == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (**(_Invoker_type *)((long)&(_Var7._M_head_impl)->h + 0xd8))
                  ((_Any_data *)((long)&(_Var7._M_head_impl)->h + 0xc0),path);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001288a6;
      }
    }
    if (*(long *)((long)_Var7._M_head_impl + 0xf0) != 0) {
      bVar3 = JSON::isArray(j);
      _Var7._M_head_impl =
           (this->m)._M_t.
           super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>.
           _M_t.
           super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>
           .super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
      if (bVar3) {
        local_e8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (j->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_e8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (j->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_e8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_e8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_e8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_e8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_e8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        if (*(long *)((long)&(_Var7._M_head_impl)->h + 0xf0) == 0) {
          std::__throw_bad_function_call();
        }
        (**(_Invoker_type *)((long)&(_Var7._M_head_impl)->h + 0xf8))
                  ((_Any_data *)((long)&(_Var7._M_head_impl)->h + 0xe0),path,&local_e8);
        if (local_e8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_118._M_dataplus._M_p = (pointer)0x0;
        local_98._M_unused._M_object = (void *)0x0;
        local_98._8_8_ = 0;
        local_88 = (code *)0x0;
        pcStack_80 = (code *)0x0;
        local_98._M_unused._M_object = operator_new(0x18);
        *(string **)local_98._M_unused._0_8_ = &local_118;
        *(string **)((long)local_98._M_unused._0_8_ + 8) = path;
        *(JSONHandler **)((long)local_98._M_unused._0_8_ + 0x10) = this;
        pcStack_80 = std::
                     _Function_handler<void_(JSON),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/JSONHandler.cc:170:28)>
                     ::_M_invoke;
        local_88 = std::
                   _Function_handler<void_(JSON),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/JSONHandler.cc:170:28)>
                   ::_M_manager;
        JSON::forEachArrayItem(j,(function<void_(JSON)> *)&local_98);
        if (local_88 != (code *)0x0) {
          (*local_88)(&local_98,&local_98,__destroy_functor);
        }
        _Var7._M_head_impl =
             (this->m)._M_t.
             super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>
             ._M_t.
             super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>
             .super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
        if (*(_Manager_type *)((long)&(_Var7._M_head_impl)->h + 0x110) == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (**(_Invoker_type *)((long)&(_Var7._M_head_impl)->h + 0x118))
                  ((_Any_data *)((long)&(_Var7._M_head_impl)->h + 0x100),path);
        goto LAB_001288a6;
      }
    }
    this_00 = *(JSONHandler **)((long)_Var7._M_head_impl + 0x170);
    if (this_00 == (JSONHandler *)0x0) {
      std::operator+(&local_50,"JSON handler: value at ",path);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_118._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_118._M_dataplus._M_p == psVar8) {
        local_118.field_2._M_allocated_capacity = *psVar8;
        local_118.field_2._8_8_ = plVar5[3];
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      }
      else {
        local_118.field_2._M_allocated_capacity = *psVar8;
      }
      local_118._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      usage(&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,
                        CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                 local_b8.field_2._M_local_buf[0]) + 1);
      }
      _Unwind_Resume(extraout_RAX);
    }
    local_f8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (j->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_f8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (j->m).super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_f8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_f8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_f8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_f8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_f8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    handle(this_00,path,&local_f8);
    if (local_f8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    bVar3 = JSON::getString(j,&local_b8);
    _Var7._M_head_impl =
         (this->m)._M_t.
         super___uniq_ptr_impl<JSONHandler::Members,_std::default_delete<JSONHandler::Members>_>.
         _M_t.
         super__Tuple_impl<0UL,_JSONHandler::Members_*,_std::default_delete<JSONHandler::Members>_>.
         super__Head_base<0UL,_JSONHandler::Members_*,_false>._M_head_impl;
    if (!bVar3) goto LAB_001284ee;
    if (*(long *)((long)&(_Var7._M_head_impl)->h + 0x50) == 0) goto LAB_001288d2;
    p_Var9 = (_Any_data *)((long)&(_Var7._M_head_impl)->h + 0x40);
    pp_Var6 = (_Invoker_type *)((long)&(_Var7._M_head_impl)->h + 0x58);
LAB_0012851c:
    (**pp_Var6)(p_Var9,path,&local_b8);
  }
LAB_001288a6:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,
                    CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                             local_b8.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void
JSONHandler::handle(std::string const& path, JSON j)
{
    if (m->h.any_handler) {
        m->h.any_handler(path, j);
        return;
    }

    bool bvalue = false;
    std::string s_value;
    if (m->h.null_handler && j.isNull()) {
        m->h.null_handler(path);
        return;
    }
    if (m->h.string_handler && j.getString(s_value)) {
        m->h.string_handler(path, s_value);
        return;
    }
    if (m->h.number_handler && j.getNumber(s_value)) {
        m->h.number_handler(path, s_value);
        return;
    }
    if (m->h.bool_handler && j.getBool(bvalue)) {
        m->h.bool_handler(path, bvalue);
        return;
    }
    if (m->h.dict_start_handler && j.isDictionary()) {
        m->h.dict_start_handler(path, j);
        std::string path_base = path;
        if (path_base != ".") {
            path_base += ".";
        }
        j.forEachDictItem([&path, &path_base, this](std::string const& k, JSON v) {
            auto i = m->h.dict_handlers.find(k);
            if (i == m->h.dict_handlers.end()) {
                if (m->h.fallback_dict_handler.get()) {
                    m->h.fallback_dict_handler->handle(path_base + k, v);
                } else {
                    QTC::TC("libtests", "JSONHandler unexpected key");
                    usage("JSON handler found unexpected key " + k + " in object at " + path);
                }
            } else {
                i->second->handle(path_base + k, v);
            }
        });
        m->h.dict_end_handler(path);
        return;
    }
    if (m->h.array_start_handler && j.isArray()) {
        m->h.array_start_handler(path, j);
        size_t i = 0;
        j.forEachArrayItem([&i, &path, this](JSON v) {
            m->h.array_item_handler->handle(path + "[" + std::to_string(i) + "]", v);
            ++i;
        });
        m->h.array_end_handler(path);
        return;
    }

    if (m->h.fallback_handler) {
        m->h.fallback_handler->handle(path, j);
        return;
    }

    // It would be nice to include information about what type the object was and what types were
    // allowed, but we're relying on schema validation to make sure input is properly structured
    // before calling the handlers. It would be different if this code were trying to be part of a
    // general-purpose JSON package.
    QTC::TC("libtests", "JSONHandler unhandled value");
    usage("JSON handler: value at " + path + " is not of expected type");
}